

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-world.c
# Opt level: O1

void process_world(chunk *c)

{
  uint32_t *puVar1;
  wchar_t *pwVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  uint16_t uVar6;
  int iVar7;
  curse_data *pcVar8;
  uint16_t *puVar9;
  undefined8 uVar10;
  player_body body;
  chunk_conflict *pcVar11;
  curse *pcVar12;
  player *ppVar13;
  _Bool _Var14;
  _Bool _Var15;
  short sVar16;
  wchar_t wVar17;
  wchar_t wVar18;
  uint32_t uVar19;
  int iVar20;
  monster_conflict *mon;
  queue *q;
  size_t sVar21;
  uintptr_t uVar22;
  loc lVar23;
  loc grid;
  player_upkeep *ppVar24;
  square *psVar25;
  trap *ptVar26;
  uint uVar27;
  long lVar28;
  uint8_t uVar29;
  ulong uVar30;
  bool bVar31;
  char *fmt;
  chunk *c_00;
  long lVar32;
  ulong uVar33;
  object *poVar34;
  bool bVar35;
  source sVar36;
  source origin;
  source origin_00;
  uint local_8c;
  loc next;
  _Bool ident;
  queue *local_78;
  chunk *local_70;
  ulong local_68;
  player *local_60;
  int local_54;
  ulong local_50;
  ulong local_48;
  undefined4 *local_40;
  ulong local_38;
  
  wVar17 = cave_monster_count((chunk_conflict *)c);
  if ((int)(uint)z_info->level_monster_max < wVar17 + L' ') {
    compact_monsters(c,L'@');
  }
  wVar17 = cave_monster_count((chunk_conflict *)c);
  wVar18 = cave_monster_max((chunk_conflict *)c);
  if (wVar17 + L' ' < wVar18) {
    compact_monsters(c,L'\0');
  }
  if ((long)turn % (long)(ulong)((uint)z_info->day_length * 10 >> 2) == 0) {
    play_ambient_sound();
  }
  lVar28 = (long)turn;
  if (player->depth == 0) {
    if (lVar28 % (long)((ulong)z_info->day_length * 5) == 0) {
      bVar35 = lVar28 % (long)((ulong)((uint)z_info->day_length * 2) * 5) == 0;
      fmt = "The sun has fallen.";
      if (bVar35) {
        fmt = "The sun has risen.";
      }
      msg(fmt);
      cave_illuminate(c,bVar35);
    }
  }
  else if (lVar28 % (long)((ulong)((uint)z_info->store_turns * 2) * 5) == 0) {
    daycount = daycount + 1;
  }
  _Var14 = flag_has_dbg((player->state).pflags,3,0xc,"player->state.pflags","(PF_UNLIGHT)");
  if (_Var14) {
    puVar1 = &player->upkeep->update;
    *puVar1 = *puVar1 | 1;
  }
  uVar19 = Rand_div((uint)z_info->alloc_monster_chance);
  if (uVar19 == 0) {
    pick_and_place_distant_monster
              (c,player->grid,(uint)z_info->max_sight + L'\x05',true,(int)player->depth);
  }
  ppVar13 = player;
  if (player->timed[7] != 0) {
    wVar17 = player_apply_damage_reduction(player,L'\x01');
    take_hit(ppVar13,wVar17,"poison");
    if (player->is_dead != false) {
      return;
    }
  }
  if (player->timed[8] != 0) {
    _Var14 = flag_has_dbg((player->state).pflags,3,0xd,"player->state.pflags","(PF_ROCK)");
    wVar17 = L'\0';
    if (!_Var14) {
      _Var14 = player_timed_grade_eq(player,L'\b',"Mortal Wound");
      wVar17 = L'\x03';
      if ((!_Var14) && (_Var14 = player_timed_grade_eq(player,L'\b',"Deep Gash"), !_Var14)) {
        _Var14 = player_timed_grade_eq(player,L'\b',"Severe Cut");
        wVar17 = (uint)_Var14 + L'\x01';
      }
    }
    ppVar13 = player;
    wVar17 = player_apply_damage_reduction(player,wVar17);
    take_hit(ppVar13,wVar17,"a fatal wound");
    if (player->is_dead != false) {
      return;
    }
  }
  sVar16 = player->timed[0x31];
  if (sVar16 != 0) {
    wVar17 = L'\0';
    if (sVar16 < 10) {
      wVar17 = L'\n' - sVar16;
    }
    player_over_exert(player,L'È',wVar17,(int)player->chp / 10);
    if (player->is_dead != false) {
      return;
    }
  }
  if (player->timed[0x2b] != 0) {
    ident = false;
    sVar36 = source_player();
    origin.which = sVar36.which;
    origin._4_4_ = 0;
    origin.what = sVar36.what;
    effect_simple(L'\x03',origin,"30",L'\0',L'\0',L'\0',L'\0',L'\0',&ident);
  }
  if (player->timed[0x32] != 0) {
    uVar19 = Rand_div(2);
    if (uVar19 == 0) {
      msg("The Black Breath sickens you.");
      player_stat_dec(player,L'\x04',false);
    }
    uVar19 = Rand_div(2);
    if (uVar19 == 0) {
      msg("The Black Breath saps your strength.");
      player_stat_dec(player,L'\0',false);
    }
    uVar19 = Rand_div(2);
    if (uVar19 == 0) {
      iVar20 = player->exp;
      uVar4 = z_info->life_drain_percent;
      msg("The Black Breath dims your life force.");
      player_exp_lose(player,(uint)uVar4 * (iVar20 / 100) + 100,false);
    }
  }
  _Var14 = player_timed_grade_eq(player,L'\n',"Full");
  if (_Var14) {
    player_dec_timed(player,L'\n',5000 / z_info->food_value,false,true);
    puVar1 = &player->upkeep->update;
    *puVar1 = *puVar1 | 1;
  }
  else {
    if ((turn * -0x3d70a3d7 + 0x51eb850U >> 2 | turn * 0x40000000) < 0x28f5c29) {
      bVar3 = "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x03\x03\x03\x03\x03\x04\x04\x04\x04\x04\x05\x05\x05\x05\x06\x06\a\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$$%%&&\'\'((()))***+++,,,,-----...../////0000011111111111111111111"
              [(player->state).speed];
      uVar4 = z_info->move_energy;
      uVar5 = z_info->food_value;
      _Var14 = player_of_has(player,L'\f');
      _Var15 = player_of_has(player,L'\n');
      wVar17 = (((((uint)uVar4 * (uint)bVar3) / 100) * 100) / (uint)uVar5 << _Var14) >> _Var15;
      if (wVar17 < L'\x02') {
        wVar17 = L'\x01';
      }
      player_dec_timed(player,L'\n',wVar17,false,true);
    }
    if ((player->timed[0x2b] != 0) &&
       (player_dec_timed(player,L'\n',(uint)z_info->food_value << 3,false,true),
       player->timed[10] < PY_FOOD_HUNGRY)) {
      player_set_timed(player,L'+',L'\0',true,true);
    }
  }
  _Var14 = player_timed_grade_eq(player,L'\n',"Faint");
  if (_Var14) {
    if ((player->timed[3] == 0) && (uVar19 = Rand_div(10), uVar19 == 0)) {
      msg("You faint from the lack of food.");
      disturb(player);
      ppVar13 = player;
      uVar19 = Rand_div(5);
      player_inc_timed(ppVar13,L'\x03',uVar19 + L'\x01',true,true,false);
    }
  }
  else {
    _Var14 = player_timed_grade_eq(player,L'\n',"Starving");
    ppVar13 = player;
    if (_Var14) {
      wVar17 = player_apply_damage_reduction(player,(PY_FOOD_STARVE - player->timed[10]) / 10);
      take_hit(ppVar13,wVar17,"starvation");
      if (player->is_dead != false) {
        return;
      }
    }
  }
  local_70 = c;
  if (player->chp < player->mhp) {
    player_regen_hp(player);
  }
  player_regen_mana(player);
  iVar20 = adj_con_fix[(player->state).stat_ind[4]];
  lVar28 = 0;
  do {
    if (player->timed[lVar28] != 0) {
      wVar17 = (wchar_t)lVar28;
      switch(wVar17) {
      case L'\a':
      case L'\t':
switchD_00144c5e_caseD_7:
        wVar18 = iVar20 + L'\x01';
        break;
      case L'\b':
        _Var14 = player_timed_grade_eq(player,wVar17,"Mortal Wound");
        _Var15 = flag_has_dbg((player->state).pflags,3,0xd,"player->state.pflags","(PF_ROCK)");
        wVar18 = L'\0';
        if (!_Var15 && !_Var14) goto switchD_00144c5e_caseD_7;
        break;
      case L'\n':
        wVar18 = L'\0';
        break;
      default:
        wVar18 = L'\x01';
        if (wVar17 == L',') {
          mon = get_commanded_monster();
          _Var14 = los(cave,player->grid,(loc_conflict)mon->grid);
          wVar18 = L'\x01';
          if (_Var14) {
            mon_dec_timed((monster *)mon,L'\b',L'\x01',L'\0');
          }
          else {
            mon_clear_timed((monster *)mon,L'\b',L'\x01');
            player_clear_timed(player,L',',true,true);
          }
        }
      }
      player_dec_timed(player,wVar17,wVar18,false,true);
    }
    lVar28 = lVar28 + 1;
  } while (lVar28 != 0x35);
  if ((player->body).count != 0) {
    uVar30 = 0;
    do {
      poVar34 = (player->body).slots[uVar30].obj;
      if (((poVar34 != (object *)0x0) && (pcVar8 = poVar34->curses, pcVar8 != (curse_data *)0x0)) &&
         (z_info->curse_max != '\0')) {
        lVar28 = 0;
        uVar33 = 0;
        do {
          if (pcVar8[uVar33].power != L'\0') {
            pwVar2 = &pcVar8[uVar33].timeout;
            *pwVar2 = *pwVar2 + L'\xffffffff';
            pcVar12 = curses;
            if (*pwVar2 == L'\0') {
              _Var14 = do_curse_effect((wchar_t)uVar33,(player->body).slots[uVar30].obj);
              if (_Var14) {
                player_learn_curse(player,(curse *)(pcVar12->conflict_flags + lVar28 + -0x28));
              }
              wVar17 = randcalc(*(random_value *)
                                 (*(long *)(pcVar12->conflict_flags + lVar28 + -0x10) + 0x108),0,
                                RANDOMISE);
              pcVar8[uVar33].timeout = wVar17;
            }
          }
          uVar33 = uVar33 + 1;
          lVar28 = lVar28 + 0x38;
        } while (uVar33 < z_info->curse_max);
      }
      uVar30 = uVar30 + 1;
    } while (uVar30 < (player->body).count);
  }
  player_update_light(player);
  _Var14 = player_is_resting(player);
  c_00 = local_70;
  if (!_Var14) {
    next.x = (player->grid).x;
    next.y = (player->grid).y;
    local_60 = player;
    sVar16 = player->timed[0x2e];
    q = q_new((long)cave->width * (long)cave->height);
    pcVar11 = cave;
    iVar20 = cave->height;
    if (2 < iVar20) {
      iVar7 = cave->width;
      uVar30 = 1;
      do {
        if (2 < iVar7) {
          memset((pcVar11->noise).grids[uVar30] + 1,0,(ulong)(iVar7 - 2) * 2);
        }
        uVar30 = uVar30 + 1;
      } while (iVar20 - 1 != uVar30);
    }
    (pcVar11->noise).grids[next.y][next.x] = 0;
    wVar17 = grid_to_i((loc_conflict)next,pcVar11->width);
    q_push(q,(long)wVar17);
    sVar21 = q_len(q);
    c_00 = local_70;
    if (sVar21 != 0) {
      local_8c = (uint)(sVar16 != 0) * 3 + 1;
      local_68 = CONCAT44(local_68._4_4_,local_8c);
      local_78 = q;
      do {
        while( true ) {
          uVar22 = q_pop(q);
          i_to_grid((wchar_t)uVar22,cave->width,(loc_conflict *)&next);
          if (local_8c == (cave->noise).grids[next.y][next.x]) break;
          lVar28 = 0;
          do {
            lVar23 = (loc)loc_sum((loc_conflict)next,(loc_conflict)ddgrid_ddd[lVar28]);
            _Var14 = square_in_bounds(cave,lVar23);
            if ((_Var14) && (_Var14 = square_isnoflow(cave,lVar23), !_Var14)) {
              if (((cave->noise).grids[(long)lVar23 >> 0x20][lVar23.x] == 0) &&
                 (_Var14 = loc_eq(local_60->grid,(loc_conflict)lVar23), pcVar11 = cave, !_Var14)) {
                (cave->noise).grids[(long)lVar23 >> 0x20][lVar23.x] = (uint16_t)local_8c;
                wVar17 = grid_to_i((loc_conflict)lVar23,pcVar11->width);
                q_push(local_78,(long)wVar17);
              }
            }
            q = local_78;
            lVar28 = lVar28 + 1;
          } while (lVar28 != 8);
          sVar21 = q_len(local_78);
          c_00 = local_70;
          if (sVar21 == 0) goto LAB_00145091;
        }
        wVar17 = grid_to_i((loc_conflict)next,cave->width);
        q_push(q,(long)wVar17);
        local_8c = local_8c + (int)local_68;
        sVar21 = q_len(q);
      } while (sVar21 != 0);
    }
LAB_00145091:
    q_free(q);
    pcVar11 = cave;
    iVar20 = cave->height;
    if (2 < iVar20) {
      iVar7 = cave->width;
      uVar30 = 1;
      do {
        if (2 < iVar7) {
          puVar9 = (pcVar11->scent).grids[uVar30];
          uVar33 = 1;
          do {
            uVar6 = puVar9[uVar33];
            if (uVar6 != 0) {
              puVar9[uVar33] = uVar6 + 1;
            }
            uVar33 = uVar33 + 1;
          } while (iVar7 - 1 != uVar33);
        }
        uVar30 = uVar30 + 1;
      } while (uVar30 != iVar20 - 1);
    }
    if (player->timed[0x2e] == 0) {
      uVar30 = 0;
      do {
        local_54 = (int)uVar30 + -2;
        local_40 = &DAT_00262e20 + uVar30 * 5;
        local_48 = uVar30 ^ 2;
        lVar28 = 0;
        local_50 = uVar30;
        iVar20 = local_54;
        do {
          local_78 = (queue *)(ulong)(uint)local_40[lVar28];
          wVar17 = (player->grid).y + iVar20;
          local_68 = (ulong)(uint)wVar17;
          wVar18 = (int)lVar28 + (player->grid).x + L'\xfffffffe';
          local_38 = (ulong)(uint)wVar18;
          lVar23.y = wVar17;
          lVar23.x = wVar18;
          _Var14 = square_in_bounds(cave,lVar23);
          if ((_Var14) && (_Var14 = square_isnoscent(cave,lVar23), !_Var14)) {
            local_60 = (player *)CONCAT71(local_60._1_7_,lVar28 == 2 && local_48 == 0);
            iVar20 = (int)local_78;
            lVar32 = 0;
            bVar31 = false;
            bVar35 = false;
            do {
              grid = (loc)loc_sum((loc_conflict)lVar23,(loc_conflict)ddgrid_ddd[lVar32]);
              _Var14 = square_in_bounds(cave,grid);
              if (_Var14) {
                if (iVar20 - 1U == (uint)(cave->scent).grids[(long)grid >> 0x20][grid.x]) {
                  bVar31 = true;
                }
                bVar35 = bVar31;
                if ((char)local_60 != '\0') {
                  bVar35 = true;
                  bVar31 = true;
                }
              }
              lVar32 = lVar32 + 1;
            } while (lVar32 != 8);
            c_00 = local_70;
            iVar20 = local_54;
            if (bVar35) {
              (cave->scent).grids[(int)local_68][(int)local_38] = (uint16_t)local_78;
            }
          }
          lVar28 = lVar28 + 1;
        } while (lVar28 != 5);
        uVar30 = local_50 + 1;
      } while (uVar30 != 5);
    }
  }
  _Var14 = player_of_has(player,L'\x1b');
  if (_Var14) {
    if ((0 < player->exp) && (uVar19 = Rand_div(10), uVar19 == 0)) {
      iVar20 = damroll(10,6);
      player_exp_lose(player,(int)((uint)z_info->life_drain_percent * (player->exp / 100) + iVar20)
                             / 10,false);
    }
    equip_learn_flag(player,L'\x1b');
  }
  poVar34 = player->gear;
  do {
    if (poVar34 == (object *)0x0) {
      if (1 < cave->obj_max) {
        uVar30 = 1;
        do {
          poVar34 = cave->objects[uVar30];
          if ((poVar34 != (object *)0x0) && (_Var14 = tval_can_have_timeout(poVar34), _Var14)) {
            recharge_timeout(poVar34);
          }
          uVar30 = uVar30 + 1;
        } while (uVar30 < cave->obj_max);
      }
      if ((turn * -0x3d70a3d7 + 0x51eb850U >> 2 | turn * 0x40000000) < 0x28f5c29) {
        equip_learn_after_time(player);
      }
      if (L'\0' < c_00->height) {
        wVar17 = L'\0';
        do {
          if (L'\0' < c_00->width) {
            wVar18 = L'\0';
            do {
              lVar23 = (loc)loc(wVar18,wVar17);
              psVar25 = square((chunk_conflict *)c_00,lVar23);
              ptVar26 = psVar25->trap;
              if (ptVar26 != (trap *)0x0) {
                bVar35 = false;
                do {
                  if ((ptVar26->timeout != '\0') &&
                     (uVar29 = ptVar26->timeout + 0xff, ptVar26->timeout = uVar29, uVar29 == '\0'))
                  {
                    bVar35 = true;
                  }
                  ptVar26 = ptVar26->next;
                } while (ptVar26 != (trap *)0x0);
                if ((bVar35) && (_Var14 = square_isseen((chunk_conflict *)c_00,lVar23), _Var14)) {
                  square_memorize_traps(c_00,lVar23);
                  square_light_spot(c_00,lVar23);
                }
              }
              wVar18 = wVar18 + L'\x01';
            } while (wVar18 < c_00->width);
          }
          wVar17 = wVar17 + L'\x01';
        } while (wVar17 < c_00->height);
      }
      ppVar13 = player;
      if (((player->word_recall != 0) && (player->upkeep->arena_level == false)) &&
         (sVar16 = player->word_recall + -1, player->word_recall = sVar16, sVar16 == 0)) {
        disturb(ppVar13);
        cmdq_flush();
        if (player->depth == 0) {
          msgt(0x19,"You feel yourself yanked downwards!");
          player_set_recall_depth(player);
          wVar17 = (wchar_t)player->recall_depth;
        }
        else {
          msgt(0x19,"You feel yourself yanked upwards!");
          wVar17 = L'\0';
        }
        dungeon_change_level(player,wVar17);
      }
      ppVar13 = player;
      if ((player->deep_descent != 0) &&
         (sVar16 = player->deep_descent + -1, player->deep_descent = sVar16, sVar16 == 0)) {
        wVar17 = dungeon_get_next_level
                           (ppVar13,(int)ppVar13->max_depth,
                            (uint)(ushort)(4 / z_info->stair_skip + 1));
        disturb(player);
        if (player->depth < wVar17) {
          msgt(0x19,"The floor opens beneath you!");
          dungeon_change_level(player,wVar17);
        }
        else {
          msgt(0x19,"You are thrown back in an explosion!");
          sVar36 = source_none();
          origin_00.which = sVar36.which;
          origin_00._4_4_ = 0;
          origin_00.what = sVar36.what;
          effect_simple(L'?',origin_00,"0",L'\0',L'\x05',L'\0',L'\0',L'\0',(_Bool *)0x0);
        }
      }
      return;
    }
    if (poVar34->kind == (object_kind *)0x0) {
      __assert_fail("obj->kind",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/game-world.c"
                    ,0xce,"void recharge_objects(void)");
    }
    uVar10 = *(undefined8 *)&(player->body).count;
    body.name._4_4_ = (int)((ulong)(player->body).name >> 0x20);
    body._0_12_ = *(undefined1 (*) [12])&player->body;
    body._16_4_ = (int)uVar10;
    body._20_4_ = (int)((ulong)uVar10 >> 0x20);
    body.slots = (player->body).slots;
    _Var14 = object_is_equipped(body,poVar34);
    if (_Var14) {
      _Var14 = recharge_timeout(poVar34);
      if (_Var14) {
        recharged_notice(poVar34,true);
        ppVar24 = player->upkeep;
        uVar27 = 0x40000;
LAB_001453ce:
        ppVar24->redraw = ppVar24->redraw | uVar27;
      }
    }
    else {
      wVar17 = number_charging(poVar34);
      bVar3 = poVar34->number;
      _Var14 = tval_can_have_timeout(poVar34);
      if ((_Var14) && (_Var14 = recharge_timeout(poVar34), _Var14)) {
        if ((poVar34->timeout == 0) || (wVar17 == (uint)bVar3)) {
          recharged_notice(poVar34,poVar34->timeout == 0);
        }
        ppVar24 = player->upkeep;
        ppVar24->notice = ppVar24->notice | 1;
        uVar27 = 0x20000;
        goto LAB_001453ce;
      }
    }
    poVar34 = poVar34->next;
  } while( true );
}

Assistant:

void process_world(struct chunk *c)
{
	int i, y, x;

	/* Compact the monster list if we're approaching the limit */
	if (cave_monster_count(c) + 32 > z_info->level_monster_max)
		compact_monsters(c, 64);

	/* Too many holes in the monster list - compress */
	if (cave_monster_count(c) + 32 < cave_monster_max(c))
		compact_monsters(c, 0);

	/*** Check the Time ***/

	/* Play an ambient sound at regular intervals. */
	if (!(turn % ((10L * z_info->day_length) / 4)))
		play_ambient_sound();

	/* Handle stores and sunshine */
	if (!player->depth) {
		/* Daybreak/Nighfall in town */
		if (!(turn % ((10L * z_info->day_length) / 2))) {
			/* Check for dawn */
			bool dawn = (!(turn % (10L * z_info->day_length)));

			if (dawn) {
				/* Day breaks */
				msg("The sun has risen.");
			} else {
				/* Night falls */
				msg("The sun has fallen.");
			}

			/* Illuminate */
			cave_illuminate(c, dawn);
		}
	} else {
		/* Update the stores once a day (while in the dungeon).
		   The changes are not actually made until return to town,
		   to avoid giving details away in the knowledge menu. */
		if (!(turn % (10L * z_info->store_turns))) daycount++;
	}

	/* Check for light change */
	if (player_has(player, PF_UNLIGHT)) {
		player->upkeep->update |= PU_BONUS;
	}

	/* Check for creature generation */
	if (one_in_(z_info->alloc_monster_chance)) {
		(void)pick_and_place_distant_monster(c, player->grid,
			z_info->max_sight + 5, true, player->depth);
	}

	/*** Damage (or healing) over Time ***/

	/* Take damage from poison */
	if (player->timed[TMD_POISONED]) {
		take_hit(player, player_apply_damage_reduction(player, 1),
			"poison");
		if (player->is_dead) {
			return;
		}
	}

	/* Take damage from cuts, worse from serious cuts */
	if (player->timed[TMD_CUT]) {
		if (player_has(player, PF_ROCK)) {
			/* Rock players just maintain */
			i = 0;
		} else if (player_timed_grade_eq(player, TMD_CUT, "Mortal Wound") ||
				   player_timed_grade_eq(player, TMD_CUT, "Deep Gash")) {
			i = 3;
		} else if (player_timed_grade_eq(player, TMD_CUT, "Severe Cut")) {
			i = 2;
		} else {
			i = 1;
		}

		/* Take damage */
		take_hit(player, player_apply_damage_reduction(player, i),
			"a fatal wound");
		if (player->is_dead) {
			return;
		}
	}

	/* Side effects of diminishing bloodlust */
	if (player->timed[TMD_BLOODLUST]) {
		player_over_exert(player, PY_EXERT_HP | PY_EXERT_CUT | PY_EXERT_SLOW,
						  MAX(0, 10 - player->timed[TMD_BLOODLUST]),
						  player->chp / 10);
		if (player->is_dead) {
			return;
		}
	}

	/* Timed healing */
	if (player->timed[TMD_HEAL]) {
		bool ident = false;
		effect_simple(EF_HEAL_HP, source_player(), "30", 0, 0, 0, 0, 0, &ident);
	}

	/* Effects of Black Breath */
	if (player->timed[TMD_BLACKBREATH]) {
		if (one_in_(2)) {
			msg("The Black Breath sickens you.");
			player_stat_dec(player, STAT_CON, false);
		}
		if (one_in_(2)) {
			msg("The Black Breath saps your strength.");
			player_stat_dec(player, STAT_STR, false);
		}
		if (one_in_(2)) {
			/* Life draining */
			int drain = 100 + (player->exp / 100) * z_info->life_drain_percent;
			msg("The Black Breath dims your life force.");
			player_exp_lose(player, drain, false);
		}
	}

	/*** Check the Food, and Regenerate ***/

	/* Digest */
	if (!player_timed_grade_eq(player, TMD_FOOD, "Full")) {
		/* Digest normally */
		if (!(turn % 100)) {
			/* Basic digestion rate based on speed */
			i = turn_energy(player->state.speed);

			/* Adjust for food value */
			i = (i * 100) / z_info->food_value;

			/* Regeneration takes more food */
			if (player_of_has(player, OF_REGEN)) i *= 2;

			/* Slow digestion takes less food */
			if (player_of_has(player, OF_SLOW_DIGEST)) i /= 2;

			/* Minimal digestion */
			if (i < 1) i = 1;

			/* Digest some food */
			player_dec_timed(player, TMD_FOOD, i, false, true);
		}

		/* Fast metabolism */
		if (player->timed[TMD_HEAL]) {
			player_dec_timed(player, TMD_FOOD,
				8 * z_info->food_value, false, true);
			if (player->timed[TMD_FOOD] < PY_FOOD_HUNGRY) {
				player_set_timed(player, TMD_HEAL, 0, true,
					true);
			}
		}
	} else {
		/* Digest quickly when gorged */
		player_dec_timed(player, TMD_FOOD, 5000 / z_info->food_value,
			false, true);
		player->upkeep->update |= PU_BONUS;
	}

	/* Faint or starving */
	if (player_timed_grade_eq(player, TMD_FOOD, "Faint")) {
		/* Faint occasionally */
		if (!player->timed[TMD_PARALYZED] && one_in_(10)) {
			/* Message */
			msg("You faint from the lack of food.");
			disturb(player);

			/* Faint (bypass free action) */
			(void)player_inc_timed(player, TMD_PARALYZED,
				1 + randint0(5), true, true, false);
		}
	} else if (player_timed_grade_eq(player, TMD_FOOD, "Starving")) {
		/* Calculate damage */
		i = (PY_FOOD_STARVE - player->timed[TMD_FOOD]) / 10;

		/* Take damage */
		take_hit(player, player_apply_damage_reduction(player, i),
			"starvation");
		if (player->is_dead) {
			return;
		}
	}

	/* Regenerate Hit Points if needed */
	if (player->chp < player->mhp)
		player_regen_hp(player);

	/* Regenerate or lose mana */
	player_regen_mana(player);

	/* Timeout various things */
	decrease_timeouts();

	/* Process light */
	player_update_light(player);

	/* Update noise and scent (not if resting) */
	if (!player_is_resting(player)) {
		make_noise(player);
		update_scent();
	}


	/*** Process Inventory ***/

	/* Handle experience draining */
	if (player_of_has(player, OF_DRAIN_EXP)) {
		if ((player->exp > 0) && one_in_(10)) {
			int32_t d = damroll(10, 6) +
				(player->exp / 100) * z_info->life_drain_percent;
			player_exp_lose(player, d / 10, false);
		}

		equip_learn_flag(player, OF_DRAIN_EXP);
	}

	/* Recharge activatable objects and rods */
	recharge_objects();

	/* Notice things after time */
	if (!(turn % 100))
		equip_learn_after_time(player);

	/* Decrease trap timeouts */
	for (y = 0; y < c->height; y++) {
		for (x = 0; x < c->width; x++) {
			struct loc grid = loc(x, y);
			struct trap *trap = square(c, grid)->trap;
			bool changed = false;
			while (trap) {
				if (trap->timeout) {
					trap->timeout--;
					if (!trap->timeout) {
						changed = true;
					}
				}
				trap = trap->next;
			}
			if (changed && square_isseen(c, grid)) {
				square_memorize_traps(c, grid);
				square_light_spot(c, grid);
			}
		}
	}


	/*** Involuntary Movement ***/

	/* Delayed Word-of-Recall; suspended in arenas */
	if (player->word_recall && !player->upkeep->arena_level) {
		/* Count down towards recall */
		player->word_recall--;

		/* Activate the recall */
		if (!player->word_recall) {
			/*
			 * Disturbing!  Also, flush the command queue to avoid
			 * losing an action on the new level
			 */
			disturb(player);
			cmdq_flush();

			/* Determine the level */
			if (player->depth) {
				msgt(MSG_TPLEVEL, "You feel yourself yanked upwards!");
				dungeon_change_level(player, 0);
			} else {
				msgt(MSG_TPLEVEL, "You feel yourself yanked downwards!");
				player_set_recall_depth(player);
				dungeon_change_level(player, player->recall_depth);
			}
		}
	}

	/* Delayed Deep Descent */
	if (player->deep_descent) {
		/* Count down towards descent */
		player->deep_descent--;

		/* Activate the descent */
		if (player->deep_descent == 0) {
			/* Calculate target depth */
			int target_increment = (4 / z_info->stair_skip) + 1;
			int target_depth = dungeon_get_next_level(player,
				player->max_depth, target_increment);
			disturb(player);

			/* Determine the level */
			if (target_depth > player->depth) {
				msgt(MSG_TPLEVEL, "The floor opens beneath you!");
				dungeon_change_level(player, target_depth);
			} else {
				/* Otherwise do something disastrous */
				msgt(MSG_TPLEVEL, "You are thrown back in an explosion!");
				effect_simple(EF_DESTRUCTION, source_none(), "0", 0, 5, 0, 0, 0, NULL);
			}
		}
	}
}